

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void add_bb_insn_dead_vars(gen_ctx_t gen_ctx)

{
  ulong *puVar1;
  ulong uVar2;
  dead_var_t_conflict pdVar3;
  VARR_MIR_reg_t *pVVar4;
  byte bVar5;
  MIR_op_t *pMVar6;
  uint uVar7;
  uint uVar8;
  gen_ctx_t dst;
  MIR_insn_t __ptr;
  bitmap_t pVVar9;
  gen_ctx *pgVar10;
  MIR_item_t_conflict pMVar11;
  MIR_item_t pMVar12;
  undefined8 *puVar13;
  void *pvVar14;
  bb_insn_t_conflict elem;
  gen_ctx *pgVar15;
  bb_t_conflict pbVar16;
  dead_var_t_conflict *ppdVar17;
  bitmap_t *ppVVar18;
  ulong uVar19;
  gen_ctx_t bb_insn;
  ulong uVar20;
  ulong uVar21;
  gen_ctx_t in_RSI;
  gen_ctx_t pgVar22;
  size_t sVar23;
  FILE *pFVar24;
  MIR_reg_t *reg_map;
  bool bVar25;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  int local_8c;
  gen_ctx_t local_88;
  uint local_80;
  undefined1 local_7c [20];
  size_t local_68;
  bb_t_conflict local_60;
  dead_var_t_conflict *local_58;
  gen_ctx_t local_50;
  gen_ctx_t local_48;
  MIR_op_t *local_40;
  ulong local_38;
  
  if (gen_ctx->optimize_level == 0) {
LAB_0015ebdf:
    __assert_fail("gen_ctx->optimize_level > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1802,"void add_bb_insn_dead_vars(gen_ctx_t)");
  }
  dst = (gen_ctx_t)malloc(0x18);
  pgVar22 = (gen_ctx_t)0x20;
  dst->ctx = (MIR_context_t)0x0;
  ((DLIST_LINK_MIR_insn_t *)&dst->optimize_level)->prev = (MIR_insn_t)0x4;
  __ptr = (MIR_insn_t)malloc(0x20);
  dst->curr_func_item = (MIR_item_t)__ptr;
  pbVar16 = (gen_ctx->curr_cfg->bbs).head;
  if (pbVar16 != (bb_t_conflict)0x0) {
    local_50 = (gen_ctx_t)&gen_ctx->free_dead_vars;
    local_58 = &(gen_ctx->free_dead_vars).tail;
    do {
      in_RSI = (gen_ctx_t)pbVar16->out;
      pgVar22 = dst;
      bitmap_copy((bitmap_t)dst,(const_bitmap_t)in_RSI);
      bb_insn = (gen_ctx_t)(pbVar16->bb_insns).tail;
      local_60 = pbVar16;
      while (bb_insn != (gen_ctx_t)0x0) {
        local_48 = *(gen_ctx_t *)&bb_insn->debug_level;
        in_RSI = bb_insn;
        pgVar22 = gen_ctx;
        clear_bb_insn_dead_vars(gen_ctx,(bb_insn_t_conflict)bb_insn);
        pgVar10 = (gen_ctx *)bb_insn->ctx;
        uVar20 = (ulong)pgVar10->debug_file >> 0x20;
        local_88 = bb_insn;
        if (uVar20 != 0) {
          sVar23 = 0;
          do {
            pgVar22 = (gen_ctx_t)gen_ctx->ctx;
            in_RSI = pgVar10;
            MIR_insn_op_mode((MIR_context_t)pgVar22,(MIR_insn_t_conflict)pgVar10,sVar23,&local_8c);
            if (local_8c != 0) {
              if (*(char *)(pgVar10->call_used_hard_regs + sVar23 * 6 + -8) == '\x02') {
                pgVar22 = (gen_ctx_t)gen_ctx->lr_ctx;
                in_RSI = (gen_ctx_t)(ulong)*(uint *)(pgVar10->call_used_hard_regs + sVar23 * 6 + -7)
                ;
                uVar7 = var_to_scan_var(pgVar22,*(uint *)(pgVar10->call_used_hard_regs +
                                                         sVar23 * 6 + -7));
                if ((-1 < (int)uVar7) && ((ulong)uVar7 < (ulong)((long)dst->ctx << 6))) {
                  bVar5 = (byte)uVar7 & 0x3f;
                  in_RSI = (gen_ctx_t)(-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                  puVar1 = (ulong *)((long)((MIR_insn_t)dst->curr_func_item)->ops +
                                    (ulong)(uVar7 >> 6) * 8 + -0x20);
                  *puVar1 = *puVar1 & (ulong)in_RSI;
                }
              }
              else if (*(char *)(pgVar10->call_used_hard_regs + sVar23 * 6 + -8) != '\v') {
                __assert_fail("op_ref->mode == MIR_OP_VAR",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x4ff,
                              "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                             );
              }
            }
            sVar23 = sVar23 + 1;
          } while (sVar23 < uVar20);
        }
        pFVar24 = pgVar10->debug_file;
        if ((gen_ctx->lr_ctx->scan_vars_num == 0) && (0xfffffffc < (int)pFVar24 - 0xaaU)) {
          in_RSI = dst;
          pgVar22 = dst;
          bitmap_and_compl((bitmap_t)dst,(bitmap_t)dst,gen_ctx->call_used_hard_regs[0x12]);
          pFVar24 = pgVar10->debug_file;
        }
        uVar20 = (ulong)pFVar24 >> 0x20;
        if (uVar20 != 0) {
          local_40 = (MIR_op_t *)&pgVar10->debug_level;
          uVar21 = 0;
          uVar19 = 0;
          local_7c._4_8_ = &local_88->tied_regs;
          local_7c._12_8_ = pgVar10;
          sVar23 = uVar19;
          local_38 = uVar20;
          pMVar6 = local_40;
LAB_0015e8e7:
          do {
            local_68 = sVar23;
            pgVar22 = (gen_ctx_t)gen_ctx->ctx;
            in_RSI = pgVar10;
            MIR_insn_op_mode((MIR_context_t)pgVar22,(MIR_insn_t_conflict)pgVar10,local_68,&local_8c)
            ;
            if ((local_8c == 0) || (pMVar6[uVar19].field_0x8 == '\v')) {
              if (uVar21 < 2) {
                if (pMVar6[uVar19].field_0x8 == '\v') {
                  do {
                    uVar7 = *(uint *)((long)&pMVar6[uVar19].u + (ulong)(uVar21 != 0) * 4 + 0x10);
                    if (uVar7 != 0xffffffff) {
                      uVar21 = uVar21 + 1;
                      goto LAB_0015e964;
                    }
                    bVar25 = uVar21 == 0;
                    uVar21 = 1;
                    pgVar10 = (gen_ctx *)local_7c._12_8_;
                  } while (bVar25);
                }
                else if (uVar21 != 1) {
                  uVar21 = 0;
                  if (pMVar6[uVar19].field_0x8 != '\x02') goto LAB_0015ea9d;
                  uVar7 = pMVar6[uVar19].u.reg;
                  uVar21 = 1;
LAB_0015e964:
                  pgVar22 = (gen_ctx_t)gen_ctx->lr_ctx;
                  in_RSI = (gen_ctx_t)(ulong)uVar7;
                  uVar8 = var_to_scan_var(pgVar22,uVar7);
                  if (-1 < (int)uVar8) {
                    pgVar22 = dst;
                    bitmap_expand((bitmap_t)dst,(ulong)uVar8 + 1);
                    uVar20 = local_38;
                    uVar2 = *(ulong *)((long)((MIR_insn_t)dst->curr_func_item)->ops +
                                      (ulong)(uVar8 >> 6) * 8 + -0x20);
                    in_RSI = (gen_ctx_t)(uVar2 | 1L << ((ulong)uVar8 & 0x3f));
                    *(gen_ctx_t *)
                     ((long)((MIR_insn_t)dst->curr_func_item)->ops + (ulong)(uVar8 >> 6) * 8 + -0x20
                     ) = in_RSI;
                    if ((uVar2 >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
                      for (pVVar9 = *(bitmap_t *)local_7c._4_8_; pVVar9 != (bitmap_t)0x0;
                          pVVar9 = (bitmap_t)pVVar9->varr) {
                        if ((uint)pVVar9->els_num == uVar7) goto LAB_0015ea7c;
                      }
                      pgVar10 = (gen_ctx *)local_50->ctx;
                      if (pgVar10 != (gen_ctx *)0x0) {
                        pdVar3 = *(dead_var_t_conflict *)&pgVar10->optimize_level;
                        pgVar15 = (gen_ctx *)pgVar10->curr_func_item;
                        pgVar22 = (gen_ctx_t)&(pdVar3->dead_var_link).next;
                        if (pdVar3 == (dead_var_t_conflict)0x0) {
                          pgVar22 = local_50;
                        }
                        pgVar22->ctx = (MIR_context_t)pgVar15;
                        if (pgVar15 != (gen_ctx *)0x0) {
                          ppdVar17 = (dead_var_t_conflict *)&pgVar15->optimize_level;
LAB_0015ea25:
                          in_RSI = (gen_ctx_t)&pgVar10->optimize_level;
                          *ppdVar17 = pdVar3;
                          *(size_t *)in_RSI = 0;
                          pgVar10->curr_func_item = (MIR_item_t)0x0;
                          pgVar22 = local_50;
                          goto LAB_0015ea34;
                        }
                        ppdVar17 = local_58;
                        if ((gen_ctx *)*local_58 == pgVar10) goto LAB_0015ea25;
LAB_0015ebda:
                        add_bb_insn_dead_vars_cold_1();
                        goto LAB_0015ebdf;
                      }
                      in_RSI = (gen_ctx_t)&DAT_00000018;
                      pgVar22 = gen_ctx;
                      pgVar10 = (gen_ctx *)gen_malloc(gen_ctx,0x18);
LAB_0015ea34:
                      *(uint *)&pgVar10->ctx = uVar7;
                      pVVar9 = local_88->addr_regs;
                      if (pVVar9 == (bitmap_t)0x0) {
                        ppVVar18 = (bitmap_t *)local_7c._4_8_;
                        if (*(bitmap_t *)local_7c._4_8_ != (bitmap_t)0x0) goto LAB_0015ebd5;
                      }
                      else {
                        if (pVVar9->varr != (bitmap_el_t *)0x0) {
                          add_bb_insn_dead_vars_cold_2();
LAB_0015ebd5:
                          add_bb_insn_dead_vars_cold_3();
                          goto LAB_0015ebda;
                        }
                        ppVVar18 = (bitmap_t *)&pVVar9->varr;
                      }
                      *ppVVar18 = (bitmap_t)pgVar10;
                      pgVar10->curr_func_item = (MIR_item_t)0x0;
                      *(bitmap_t *)&pgVar10->optimize_level = pVVar9;
                      local_88->addr_regs = (bitmap_t)pgVar10;
                    }
                  }
LAB_0015ea7c:
                  pgVar10 = (gen_ctx *)local_7c._12_8_;
                  sVar23 = local_68;
                  if (uVar20 <= local_68) break;
                  goto LAB_0015e8e7;
                }
              }
              uVar21 = 0;
            }
LAB_0015ea9d:
            uVar19 = local_68 + 1;
            sVar23 = uVar19;
            pMVar6 = local_40;
          } while (uVar19 < uVar20);
        }
        bb_insn = local_48;
        if (gen_ctx->lr_ctx->scan_vars_num == 0) {
          pgVar22 = (gen_ctx_t)pgVar10->debug_file;
          in_RSI = (gen_ctx_t)local_7c;
          target_get_early_clobbered_hard_regs((MIR_insn_t)pgVar22,(MIR_reg_t *)in_RSI,&local_80);
          if (((ulong)(uint)local_7c._0_4_ != 0xffffffff) &&
             ((ulong)(uint)local_7c._0_4_ < (ulong)((long)dst->ctx << 6))) {
            bVar5 = (byte)local_7c._0_4_ & 0x3f;
            in_RSI = (gen_ctx_t)(-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            puVar1 = (ulong *)((long)((MIR_insn_t)dst->curr_func_item)->ops +
                              (ulong)((uint)local_7c._0_4_ >> 6) * 8 + -0x20);
            *puVar1 = *puVar1 & (ulong)in_RSI;
          }
          if (((ulong)local_80 != 0xffffffff) && ((ulong)local_80 < (ulong)((long)dst->ctx << 6))) {
            bVar5 = (byte)local_80 & 0x3f;
            in_RSI = (gen_ctx_t)(-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            puVar1 = (ulong *)((long)((MIR_insn_t)dst->curr_func_item)->ops +
                              (ulong)(local_80 >> 6) * 8 + -0x20);
            *puVar1 = *puVar1 & (ulong)in_RSI;
          }
          bb_insn = local_48;
          if (0xfffffffc < *(int *)&pgVar10->debug_file - 0xaaU) {
            in_RSI = dst;
            pgVar22 = dst;
            bitmap_ior((bitmap_t)dst,(bitmap_t)dst,(bitmap_t)local_88->insn_to_consider);
            bb_insn = local_48;
          }
        }
      }
      pbVar16 = (local_60->bb_link).next;
    } while (pbVar16 != (bb_t)0x0);
    __ptr = (MIR_insn_t)dst->curr_func_item;
  }
  if (__ptr != (MIR_insn_t)0x0) {
    free(__ptr);
    free(dst);
    return;
  }
  add_bb_insn_dead_vars_cold_4();
  if (pgVar22->lr_ctx->scan_vars_num == 0) {
    reg_map = (MIR_reg_t *)0x0;
  }
  else {
    pVVar4 = pgVar22->lr_ctx->scan_var_to_var_map;
    if (pVVar4 == (VARR_MIR_reg_t *)0x0) {
      output_bb_live_info_cold_1();
      pgVar10 = (gen_ctx *)gen_malloc(pgVar22,0xa8);
      pgVar10->call_used_hard_regs[6] = (bitmap_t)0x0;
      pMVar11 = (MIR_item_t_conflict)malloc(0x18);
      pMVar11->data = (void *)0x0;
      pgVar10->debug_file = (FILE *)0x0;
      *(c2mir_ctx **)&pgVar10->optimize_level = (c2mir_ctx *)0x0;
      pgVar10->curr_func_item = (MIR_item_t)0x0;
      pMVar11->module = (MIR_module_t)0x4;
      *(undefined1 (*) [32])&pgVar10->addr_insn_p = ZEXT432(0) << 0x40;
      *(undefined1 (*) [32])((long)&pgVar10->addr_regs + 3) = ZEXT432(0) << 0x40;
      pMVar12 = (MIR_item_t)malloc(0x20);
      (pMVar11->item_link).prev = pMVar12;
      pgVar10->call_used_hard_regs[0] = (bitmap_t)pMVar11;
      puVar13 = (undefined8 *)malloc(0x18);
      *puVar13 = 0;
      puVar13[1] = 4;
      pvVar14 = malloc(0x20);
      puVar13[2] = pvVar14;
      pgVar10->call_used_hard_regs[1] = (bitmap_t)puVar13;
      puVar13 = (undefined8 *)malloc(0x18);
      *puVar13 = 0;
      puVar13[1] = 4;
      pvVar14 = malloc(0x20);
      puVar13[2] = pvVar14;
      pgVar10->call_used_hard_regs[2] = (bitmap_t)puVar13;
      puVar13 = (undefined8 *)malloc(0x18);
      *puVar13 = 0;
      puVar13[1] = 4;
      pvVar14 = malloc(0x20);
      puVar13[2] = pvVar14;
      pgVar10->call_used_hard_regs[3] = (bitmap_t)puVar13;
      puVar13 = (undefined8 *)malloc(0x18);
      *puVar13 = 0;
      puVar13[1] = 4;
      pvVar14 = malloc(0x20);
      puVar13[2] = pvVar14;
      pgVar10->call_used_hard_regs[4] = (bitmap_t)puVar13;
      puVar13 = (undefined8 *)malloc(0x18);
      *puVar13 = 0;
      puVar13[1] = 4;
      pvVar14 = malloc(0x20);
      pgVar10->call_used_hard_regs[5] = (bitmap_t)puVar13;
      puVar13[2] = pvVar14;
      pgVar10->call_used_hard_regs[7] = (bitmap_t)0x0;
      if (in_RSI != (gen_ctx_t)0x0) {
        if (pgVar22->optimize_level == 0) {
          uVar7 = *(int *)&in_RSI->debug_file - 0xa7;
          if ((uVar7 < 0xe) && ((0x2007U >> (uVar7 & 0x1f) & 1) != 0)) {
            pgVar15 = (gen_ctx *)gen_malloc(pgVar22,0x10);
            in_RSI->ctx = (MIR_context_t)pgVar15;
            pgVar15->ctx = (MIR_context_t)pgVar10;
            *(undefined8 *)&pgVar15->optimize_level = 0;
          }
          else {
            in_RSI->ctx = (MIR_context_t)pgVar10;
          }
        }
        else {
          elem = create_bb_insn(pgVar22,(MIR_insn_t)in_RSI,(bb_t_conflict)pgVar10);
          DLIST_bb_insn_t_append((DLIST_bb_insn_t *)&pgVar10->temp_bitmap,elem);
        }
      }
      return;
    }
    reg_map = pVVar4->varr;
  }
  output_bb_border_live_info(pgVar22,(bb_t_conflict)in_RSI);
  output_bitmap(pgVar22,"  live_gen:",in_RSI->call_used_hard_regs[2],1,reg_map);
  output_bitmap(pgVar22,"  live_kill:",in_RSI->call_used_hard_regs[3],1,reg_map);
  return;
}

Assistant:

static void add_bb_insn_dead_vars (gen_ctx_t gen_ctx) {
  MIR_insn_t insn;
  bb_insn_t bb_insn, prev_bb_insn;
  MIR_reg_t var, early_clobbered_hard_reg1, early_clobbered_hard_reg2;
  int scan_var, op_num;
  bitmap_t live;
  insn_var_iterator_t insn_var_iter;

  /* we need all var analysis and bb insns to keep dead var info */
  gen_assert (optimize_level > 0);
  live = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb)) {
    bitmap_copy (live, bb->live_out);
    for (bb_insn = DLIST_TAIL (bb_insn_t, bb->bb_insns); bb_insn != NULL; bb_insn = prev_bb_insn) {
      prev_bb_insn = DLIST_PREV (bb_insn_t, bb_insn);
      clear_bb_insn_dead_vars (gen_ctx, bb_insn);
      insn = bb_insn->insn;
      FOREACH_OUT_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
        if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
        bitmap_clear_bit_p (live, scan_var);
      }
      if (scan_vars_num == 0 && MIR_call_code_p (insn->code))
        bitmap_and_compl (live, live, call_used_hard_regs[MIR_T_UNDEF]);
      FOREACH_IN_INSN_VAR (gen_ctx, insn_var_iter, insn, var, op_num) {
        if ((scan_var = var_to_scan_var (gen_ctx, var)) < 0) continue;
        if (bitmap_set_bit_p (live, scan_var)) add_bb_insn_dead_var (gen_ctx, bb_insn, var);
      }
      if (scan_vars_num != 0) continue;
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if (early_clobbered_hard_reg1 != MIR_NON_VAR)
        bitmap_clear_bit_p (live, early_clobbered_hard_reg1);
      if (early_clobbered_hard_reg2 != MIR_NON_VAR)
        bitmap_clear_bit_p (live, early_clobbered_hard_reg2);
      if (MIR_call_code_p (insn->code)) bitmap_ior (live, live, bb_insn->call_hard_reg_args);
    }
  }
  bitmap_destroy (live);
}